

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::insert(SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
         *this,uint *x)

{
  bool bVar1;
  InsertResult IVar2;
  iterator __first;
  iterator pvVar3;
  uint *x_local;
  SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    IVar2 = OrderedFixedStorage<unsigned_int,_3UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.used != 3) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                     );
      }
      bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                        (&this->flexible);
      if (!bVar1) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                     );
      }
      __first = std::array<unsigned_int,_3UL>::begin
                          (&(this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.storage);
      pvVar3 = std::array<unsigned_int,_3UL>::begin
                         (&(this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.storage);
      std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
      insert<unsigned_int*>
                ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                 &this->flexible,__first,
                 pvVar3 + (this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.used);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&this->flexible,x);
      bVar1 = usingFixed(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.used = 0;
    }
  }
  else {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (&this->flexible,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }